

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial-4.cpp
# Opt level: O0

void __thiscall Server::_acceptHandler(Server *this,error_code *error,socket_ptr *socket)

{
  basic_streambuf<std::allocator<char>_> *this_00;
  unsigned_long maximum_size;
  asio *this_01;
  type s;
  code *handler;
  string_view delim;
  shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_> local_b0;
  shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  local_a0;
  bind_t<void,_boost::_mfi::mf4<void,_Server,_const_boost::system::error_code_&,_unsigned_long,_boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>_>,_boost::_bi::list5<boost::_bi::value<Server_*>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::_bi::value<boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>_>_>_>
  local_90;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  undefined1 local_45;
  allocator<char> local_31;
  undefined1 local_30 [8];
  streambuf_ptr readBuffer;
  socket_ptr *socket_local;
  error_code *error_local;
  Server *this_local;
  
  readBuffer.pn.pi_ = (sp_counted_base *)socket;
  _accept(this);
  this_00 = (basic_streambuf<std::allocator<char>_> *)operator_new(0x60);
  local_45 = 1;
  maximum_size = std::numeric_limits<unsigned_long>::max();
  std::allocator<char>::allocator();
  boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (this_00,maximum_size,&local_31);
  local_45 = 0;
  boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>>>::
  shared_ptr<boost::asio::basic_streambuf<std::allocator<char>>>
            ((shared_ptr<boost::asio::basic_streambuf<std::allocator<char>>> *)local_30,this_00);
  std::allocator<char>::~allocator(&local_31);
  this_01 = (asio *)boost::
                    shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                    ::operator*(socket);
  s = boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>::operator*
                ((shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_> *)local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"\r\n\r\n");
  boost::
  shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::shared_ptr(&local_a0,socket);
  boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>::shared_ptr
            (&local_b0,(shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_> *)local_30)
  ;
  handler = boost::asio::placeholders::bytes_transferred;
  boost::
  bind<void,Server,boost::system::error_code_const&,unsigned_long,boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>>>,Server*,boost::arg<1>(*)(),boost::arg<2>(*)(),boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>>>>
            (&local_90,(boost *)_readHandler,0,this,boost::asio::placeholders::error,
             boost::asio::placeholders::bytes_transferred,&local_a0,&local_b0);
  delim._M_str = (char *)&local_90;
  delim._M_len = (size_t)local_58._M_str;
  boost::asio::
  async_read_until<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,std::allocator<char>,boost::_bi::bind_t<void,boost::_mfi::mf4<void,Server,boost::system::error_code_const&,unsigned_long,boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio___<0>>>>>>,boost::_bi::value<boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>>>>>>>
            (this_01,(basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                      *)s,(basic_streambuf<std::allocator<char>_> *)local_58._M_len,delim,
             (bind_t<void,_boost::_mfi::mf4<void,_Server,_const_boost::system::error_code_&,_unsigned_long,_boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>_>,_boost::_bi::list5<boost::_bi::value<Server_*>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::_bi::value<boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>_>_>_>
              *)handler);
  boost::_bi::
  bind_t<void,_boost::_mfi::mf4<void,_Server,_const_boost::system::error_code_&,_unsigned_long,_boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>_>,_boost::_bi::list5<boost::_bi::value<Server_*>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::_bi::value<boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>_>_>_>
  ::~bind_t(&local_90);
  boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>::~shared_ptr(&local_b0);
  boost::
  shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::~shared_ptr(&local_a0);
  boost::shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_>::~shared_ptr
            ((shared_ptr<boost::asio::basic_streambuf<std::allocator<char>_>_> *)local_30);
  return;
}

Assistant:

void _acceptHandler( const boost::system::error_code& error, socket_ptr socket ){
        // Immediately set up another acceptor. Since we are doing things asynchronously this call
        // will not block and we'll be ready to accept the next connection right away.
        _accept();

        // Just like with the synchronous version we are reading the whole message into memory and
        // then sending it off to be parsed. Here we are doing it asynchronously, and like all the
        // other Boost ASIO asynchronous methods that means making sure the socket and buffer remain
        // valid during the operation.
        streambuf_ptr readBuffer( new boost::asio::streambuf );
        boost::asio::async_read_until(
            *socket,
            *readBuffer,
            "\r\n\r\n",
            boost::bind(
                &Server::_readHandler,
                this,
                boost::asio::placeholders::error,
                boost::asio::placeholders::bytes_transferred,
                socket,
                readBuffer
            )
        );
    }